

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_multi_statemach(connectdata *conn,_Bool *done)

{
  Curl_easy *data_00;
  tftp_state_data_t *state_00;
  CURLcode CVar1;
  long lVar2;
  int *piVar3;
  char *pcVar4;
  int error;
  long timeout_ms;
  tftp_state_data_t *state;
  Curl_easy *data;
  tftp_event_t local_28;
  CURLcode result;
  tftp_event_t event;
  int rc;
  _Bool *done_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  state_00 = (conn->proto).tftpc;
  _event = done;
  done_local = (_Bool *)conn;
  lVar2 = tftp_state_timeout(conn,&local_28);
  *_event = false;
  if (lVar2 < 1) {
    Curl_failf(data_00,"TFTP response timeout");
    conn_local._4_4_ = CURLE_OPERATION_TIMEDOUT;
  }
  else {
    if (local_28 == TFTP_EVENT_NONE) {
      result = Curl_socket_check(state_00->sockfd,-1,-1,0);
      if (result == ~CURLE_OK) {
        piVar3 = __errno_location();
        pcVar4 = Curl_strerror((connectdata *)done_local,*piVar3);
        Curl_failf(data_00,"%s",pcVar4);
        state_00->event = TFTP_EVENT_ERROR;
      }
      else if (result != CURLE_OK) {
        CVar1 = tftp_receive_packet((connectdata *)done_local);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
        CVar1 = tftp_state_machine(state_00,state_00->event);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
        *_event = state_00->state == TFTP_STATE_FIN;
        if ((*_event & 1U) != 0) {
          Curl_setup_transfer((connectdata *)done_local,-1,-1,false,(curl_off_t *)0x0,-1,
                              (curl_off_t *)0x0);
        }
      }
    }
    else {
      CVar1 = tftp_state_machine(state_00,local_28);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      *_event = state_00->state == TFTP_STATE_FIN;
      if ((*_event & 1U) != 0) {
        Curl_setup_transfer((connectdata *)done_local,-1,-1,false,(curl_off_t *)0x0,-1,
                            (curl_off_t *)0x0);
      }
    }
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode tftp_multi_statemach(struct connectdata *conn, bool *done)
{
  int                   rc;
  tftp_event_t          event;
  CURLcode              result = CURLE_OK;
  struct Curl_easy  *data = conn->data;
  tftp_state_data_t     *state = (tftp_state_data_t *)conn->proto.tftpc;
  long                  timeout_ms = tftp_state_timeout(conn, &event);

  *done = FALSE;

  if(timeout_ms <= 0) {
    failf(data, "TFTP response timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  else if(event != TFTP_EVENT_NONE) {
    result = tftp_state_machine(state, event);
    if(result)
      return result;
    *done = (state->state == TFTP_STATE_FIN) ? TRUE : FALSE;
    if(*done)
      /* Tell curl we're done */
      Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);
  }
  else {
    /* no timeouts to handle, check our socket */
    rc = SOCKET_READABLE(state->sockfd, 0);

    if(rc == -1) {
      /* bail out */
      int error = SOCKERRNO;
      failf(data, "%s", Curl_strerror(conn, error));
      state->event = TFTP_EVENT_ERROR;
    }
    else if(rc != 0) {
      result = tftp_receive_packet(conn);
      if(result)
        return result;
      result = tftp_state_machine(state, state->event);
      if(result)
        return result;
      *done = (state->state == TFTP_STATE_FIN) ? TRUE : FALSE;
      if(*done)
        /* Tell curl we're done */
        Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);
    }
    /* if rc == 0, then select() timed out */
  }

  return result;
}